

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O3

int64_t Imf_3_4::istream_nonparallel_read
                  (exr_const_context_t ctxt,void *userdata,void *buffer,uint64_t sz,uint64_t offset,
                  exr_stream_error_func_ptr_t error_cb)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  uint64_t uVar4;
  long lVar5;
  void *__src;
  int64_t iVar6;
  
  if (sz >> 0x1f != 0) {
    (*error_cb)(ctxt,10,"Stream interface request to read block too large");
    return -1;
  }
  plVar1 = *(long **)((long)userdata + 0x28);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)userdata);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  uVar4 = (**(code **)(*plVar1 + 0x28))(plVar1);
  if (uVar4 != offset) {
    (**(code **)(*plVar1 + 0x30))(plVar1,offset);
    uVar4 = (**(code **)(*plVar1 + 0x28))(plVar1);
    if (uVar4 != offset) {
      iVar6 = -1;
      (*error_cb)(ctxt,10,"Unable to seek to desired offset %lu",offset);
      goto LAB_0016319f;
    }
  }
  lVar5 = (**(code **)(*plVar1 + 0x40))(plVar1);
  uVar4 = lVar5 - (offset + sz);
  if ((long)(offset + sz) <= lVar5) {
    uVar4 = sz;
  }
  if (lVar5 < 1) {
    uVar4 = sz;
  }
  cVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
  if (cVar2 == '\0') {
    (**(code **)(*plVar1 + 0x18))(plVar1,buffer,uVar4 & 0xffffffff);
  }
  else {
    __src = (void *)(**(code **)(*plVar1 + 0x20))(plVar1,uVar4 & 0xffffffff);
    if (__src != (void *)0x0) {
      memcpy(buffer,__src,uVar4);
    }
  }
  lVar5 = (**(code **)(*plVar1 + 0x28))(plVar1);
  iVar6 = lVar5 - offset;
LAB_0016319f:
  pthread_mutex_unlock((pthread_mutex_t *)userdata);
  return iVar6;
}

Assistant:

static int64_t
istream_nonparallel_read (
    exr_const_context_t         ctxt,
    void*                       userdata,
    void*                       buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    istream_holder* ih = static_cast<istream_holder*> (userdata);
    IStream*        s  = ih->_stream;

    if (sz > INT_MAX)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Stream interface request to read block too large");
        return -1;
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lk{ih->_mx};
#endif

    int64_t         nread = s->tellg ();
    try
    {
        if (offset != static_cast<size_t> (nread))
        {
            s->seekg (offset);
            nread = s->tellg ();
            if (offset != static_cast<size_t> (nread))
            {
                error_cb (
                    ctxt,
                    EXR_ERR_READ_IO,
                    "Unable to seek to desired offset %" PRIu64,
                    offset);
                return -1;
            }
        }

        int64_t stream_sz = s->size ();
        int64_t nend = nread + (int64_t)sz;
        if (stream_sz > 0 && nend > stream_sz)
        {
            sz = stream_sz - nend;
        }

        try
        {
            if (s->isMemoryMapped ())
            {
                char* data = s->readMemoryMapped (static_cast<int> (sz));
                // TODO: in a future release, pass this through to
                // core directly
                if (data)
                    memcpy (buffer, data, sz);
            }
            else
            {
                s->read (static_cast<char*> (buffer), static_cast<int> (sz));
            }
        }
        catch (...)
        {
            // bah, there could be two reasons for this, one is a
            // legitimate error, the other is a read past the end of file
            // (i.e. the core library tries to read a 4k block when
            // parsing the header), let's let the core deal with that and
            // clear errors
            ih->_stream->clear ();
            //error_cb (
            //    ctxt,
            //    EXR_ERR_READ_IO,
            //    "Unable to read requested bytes: %" PRIu64,
            //    sz);
        }
        nread = s->tellg () - nread;
    }
    catch (std::exception &e)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to seek to desired offset %" PRIu64 ": %s",
            offset,
            e.what());
        nread = -1;
    }
    catch (...)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to seek to desired offset %" PRIu64 ": Unknown error",
            offset);
        nread = -1;
    }
    return nread;
}